

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O3

void prvTidyResetTags(TidyDocImpl *doc)

{
  _DictHash *p_Var1;
  DictHash *pDVar2;
  Dict *np;
  Dict *pDVar3;
  uint i;
  long lVar4;
  
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_A) {
      pDVar3->parser = prvTidyParseBlock;
      pDVar3->model = 0x20018;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_CAPTION) {
      pDVar3->parser = prvTidyParseBlock;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_OBJECT) {
      pDVar3->model = 0x11810;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  pDVar3 = tag_defs + 1;
  do {
    if (pDVar3->id == TidyTag_BUTTON) {
      pDVar3->parser = prvTidyParseInline;
      break;
    }
    pDVar3 = pDVar3 + 1;
  } while (pDVar3 < tag_defs + 0x99);
  lVar4 = 0;
  do {
    pDVar2 = (doc->tags).hashtab[lVar4];
    while (pDVar2 != (DictHash *)0x0) {
      p_Var1 = pDVar2->next;
      (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
      pDVar2 = p_Var1;
    }
    (doc->tags).hashtab[lVar4] = (DictHash *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb2);
  doc->HTML5Mode = yes;
  return;
}

Assistant:

void TY_(ResetTags)( TidyDocImpl *doc )
{
    Dict *np = (Dict *)TY_(LookupTagDef)( TidyTag_A );
    TidyTagImpl* tags = &doc->tags;
    if (np) 
    {
        np->parser = TY_(ParseBlock);
        np->model  = (CM_INLINE|CM_BLOCK|CM_MIXED);
    }
    np = (Dict *)TY_(LookupTagDef)( TidyTag_CAPTION );
    if (np)
    {
        np->parser = TY_(ParseBlock);
    }

    np = (Dict *)TY_(LookupTagDef)( TidyTag_OBJECT );
    if (np)
    {
        np->model = (CM_OBJECT|CM_IMG|CM_INLINE|CM_PARAM); /* reset */
    }
    /*\
     * Issue #461
     * TidyTag_BUTTON reset to inline in HTML5
    \*/
    np = (Dict *)TY_(LookupTagDef)(TidyTag_BUTTON);
    if (np)
    {
        np->parser = TY_(ParseInline);
    }

    tagsEmptyHash( doc, tags ); /* not sure this is really required, but to be sure */
    doc->HTML5Mode = yes;   /* set HTML5 mode */
}